

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O3

void re2c::BitMap::gen(OutputFile *o,uint32_t ind,uint32_t lb,uint32_t ub)

{
  uint *puVar1;
  ulong __n;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint32_t n;
  OutputFile *pOVar8;
  opt_t *poVar9;
  undefined8 *puVar10;
  void *__s;
  uint *puVar11;
  undefined8 *puVar12;
  uint32_t n_00;
  uint *puVar13;
  ulong uVar14;
  uint uVar15;
  
  if ((first == (undefined8 *)0x0) || (bUsedYYBitmap != '\x01')) {
    return;
  }
  pOVar8 = OutputFile::wind(o,ind);
  pOVar8 = OutputFile::ws(pOVar8,"static const unsigned char ");
  poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  pOVar8 = OutputFile::wstring(pOVar8,&poVar9->yybm);
  OutputFile::ws(pOVar8,"[] = {");
  puVar12 = first;
  uVar15 = 0;
  puVar10 = first;
  do {
    puVar10 = (undefined8 *)puVar10[2];
    uVar15 = uVar15 + 1;
  } while (puVar10 != (undefined8 *)0x0);
  uVar6 = ub - lb;
  __n = (ulong)uVar6 * 4;
  __s = operator_new__(__n);
  if (puVar12 != (undefined8 *)0x0) {
    n_00 = 0;
    n = 1;
    do {
      memset(__s,0,__n);
      uVar7 = 0x80;
      do {
        *(uint32_t *)(puVar12 + 3) = n_00;
        *(uint *)((long)puVar12 + 0x1c) = uVar7;
        uVar14 = (ulong)*(uint *)*puVar12;
        if (uVar14 != 0) {
          lVar4 = puVar12[1];
          puVar13 = *(uint **)((uint *)*puVar12 + 2);
          puVar11 = puVar13 + uVar14 * 4;
          uVar14 = 0;
          do {
            uVar2 = *puVar13;
            if ((*(long *)(puVar13 + 2) == lVar4) && ((uint)uVar14 < 0x100 && (uint)uVar14 < uVar2))
            {
              do {
                puVar1 = (uint *)((long)__s + (ulong)((int)uVar14 - lb) * 4);
                *puVar1 = *puVar1 | uVar7;
                if (0xfe < uVar14) break;
                uVar14 = uVar14 + 1;
              } while (uVar14 < uVar2);
            }
            puVar13 = puVar13 + 4;
            uVar14 = (ulong)uVar2;
          } while (puVar13 < puVar11);
        }
        puVar12 = (undefined8 *)puVar12[2];
      } while ((puVar12 != (undefined8 *)0x0) && (bVar5 = 1 < uVar7, uVar7 = uVar7 >> 1, bVar5));
      if (8 < uVar15) {
        pOVar8 = OutputFile::ws(o,"\n");
        pOVar8 = OutputFile::wind(pOVar8,ind + 1);
        pOVar8 = OutputFile::ws(pOVar8,"/* table ");
        pOVar8 = OutputFile::wu32(pOVar8,n);
        pOVar8 = OutputFile::ws(pOVar8," .. ");
        uVar3 = n + 7;
        if (uVar15 <= n + 7) {
          uVar3 = uVar15;
        }
        pOVar8 = OutputFile::wu32(pOVar8,uVar3);
        pOVar8 = OutputFile::ws(pOVar8,": ");
        pOVar8 = OutputFile::wu32(pOVar8,n_00);
        OutputFile::ws(pOVar8," */");
      }
      if (ub != lb) {
        uVar14 = 0;
        do {
          if ((uVar14 & 7) == 0) {
            pOVar8 = OutputFile::ws(o,"\n");
            OutputFile::wind(pOVar8,ind + 1);
          }
          poVar9 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          uVar3 = *(uint32_t *)((long)__s + uVar14 * 4);
          if (poVar9->yybmHexTable == true) {
            OutputFile::wu32_hex(o,uVar3);
          }
          else {
            OutputFile::wu32_width(o,uVar3,3);
          }
          OutputFile::ws(o,", ");
          uVar14 = uVar14 + 1;
        } while (uVar6 != uVar14);
      }
      n_00 = n_00 + uVar6;
      n = n + 8;
    } while (puVar12 != (undefined8 *)0x0);
  }
  pOVar8 = OutputFile::ws(o,"\n");
  pOVar8 = OutputFile::wind(pOVar8,ind);
  OutputFile::ws(pOVar8,"};\n");
  operator_delete__(__s);
  return;
}

Assistant:

void BitMap::gen(OutputFile & o, uint32_t ind, uint32_t lb, uint32_t ub)
{
	if (first && bUsedYYBitmap)
	{
		o.wind(ind).ws("static const unsigned char ").wstring(opts->yybm).ws("[] = {");

		uint32_t c = 1, n = ub - lb;
		const BitMap *cb = first;

		while((cb = cb->next) != NULL) {
			++c;
		}
		BitMap *b = first;

		uint32_t *bm = new uint32_t[n];
		
		for (uint32_t i = 0, t = 1; b; i += n, t += 8)
		{
			memset(bm, 0, n * sizeof(uint32_t));

			for (uint32_t m = 0x80; b && m; m >>= 1)
			{
				b->i = i;
				b->m = m;
				doGen(b->go, b->on, bm, lb, m);
				b = const_cast<BitMap*>(b->next);
			}

			if (c > 8)
			{
				o.ws("\n").wind(ind+1).ws("/* table ").wu32(t).ws(" .. ").wu32(std::min(c, t+7)).ws(": ").wu32(i).ws(" */");
			}

			for (uint32_t j = 0; j < n; ++j)
			{
				if (j % 8 == 0)
				{
					o.ws("\n").wind(ind+1);
				}

				if (opts->yybmHexTable)
				{
					o.wu32_hex(bm[j]);
				}
				else
				{
					o.wu32_width(bm[j], 3);
				}
				o.ws(", ");
			}
		}

		o.ws("\n").wind(ind).ws("};\n");
		
		delete[] bm;
	}
}